

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_thread.c
# Opt level: O3

void * nhr_thread_func_priv(void *some_pointer)

{
  nhr_thread mem;
  _nhr_threads_joiner *p_Var1;
  void *local_20;
  
  (**some_pointer)(*(undefined8 *)((long)some_pointer + 8));
  if ((pthread_mutex_t *)_threads_joiner->mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)_threads_joiner->mutex);
  }
  mem = _threads_joiner->thread;
  local_20 = (void *)0x0;
  if (mem != (nhr_thread)0x0) {
    _threads_joiner->thread = (nhr_thread)0x0;
    pthread_join(mem->thread,&local_20);
    if (local_20 != (void *)0x0) {
      __assert_fail("r == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_thread.c"
                    ,0x54,"void nhr_threads_joiner_clean(void)");
    }
    nhr_free(mem);
  }
  p_Var1 = _threads_joiner;
  _threads_joiner->thread = (nhr_thread)some_pointer;
  if ((pthread_mutex_t *)p_Var1->mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)p_Var1->mutex);
  }
  return (void *)0x0;
}

Assistant:

static void * nhr_thread_func_priv(void * some_pointer) {
#endif
	nhr_thread t = (nhr_thread)some_pointer;
	t->thread_function(t->user_object);
	nhr_threads_joiner_add(t);

#if  defined(NHR_OS_WINDOWS)
	return 0;
#else
	return NULL;
#endif
}